

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O0

void __thiscall
Clone_componentWithVariables_Test::~Clone_componentWithVariables_Test
          (Clone_componentWithVariables_Test *this)

{
  Clone_componentWithVariables_Test *this_local;
  
  ~Clone_componentWithVariables_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Clone, componentWithVariables)
{
    auto c = libcellml::Component::create();
    auto u = libcellml::Units::create();
    auto v1 = libcellml::Variable::create();
    auto v2 = libcellml::Variable::create();

    u->setName("daves");
    v1->setUnits(u);

    c->setId("unique");
    c->setName("copy");

    c->addVariable(v1);
    c->addVariable(v2);

    auto cClone = c->clone();

    compareComponent(c, cClone);
}